

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O2

char __thiscall lscpp::stdio_transporter::read_char(stdio_transporter *this)

{
  size_t in_RCX;
  char c;
  
  read(0,&c,1);
  if ((this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
      super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
      super__Optional_payload_base<lscpp::comm_logger>._M_engaged == true) {
    comm_logger::open_in((comm_logger *)this);
    comm_logger::write((comm_logger *)this,(int)&c,(void *)0x1,in_RCX);
  }
  return c;
}

Assistant:

char stdio_transporter::read_char() {
  char c;
  ::read(stdin_fileno, &c, 1);

  log_in_char(comm_logger_, c);

  return c;
}